

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O1

void __thiscall Txid_TxidFromHexError_Test::TestBody(Txid_TxidFromHexError_Test *this)

{
  bool bVar1;
  Txid txid;
  string local_58;
  Txid local_38;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "123456789012345678901234567890123456789012345678901234567890123412","");
    cfd::core::Txid::Txid(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_38._vptr_Txid = (_func_int **)&PTR__Txid_007e3348;
    if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
             ,0x2d,
             "Expected: Txid txid = Txid( \"123456789012345678901234567890123456789012345678901234567890123412\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
  if (((local_38._vptr_Txid != (_func_int **)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_38._vptr_Txid != (_func_int **)0x0)) {
    (**(code **)(*local_38._vptr_Txid + 8))();
  }
  return;
}

Assistant:

TEST(Txid, TxidFromHexError) {
  EXPECT_THROW(
      Txid txid = Txid( "123456789012345678901234567890123456789012345678901234567890123412"),
      CfdException);
}